

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBExtractAlphaRow_C(uint8_t *src_argb,uint8_t *dst_a,int width)

{
  int i;
  int width_local;
  uint8_t *dst_a_local;
  uint8_t *src_argb_local;
  
  dst_a_local = dst_a;
  src_argb_local = src_argb;
  for (i = 0; i < width + -1; i = i + 2) {
    *dst_a_local = src_argb_local[3];
    dst_a_local[1] = src_argb_local[7];
    dst_a_local = dst_a_local + 2;
    src_argb_local = src_argb_local + 8;
  }
  if ((width & 1U) != 0) {
    *dst_a_local = src_argb_local[3];
  }
  return;
}

Assistant:

void ARGBExtractAlphaRow_C(const uint8_t* src_argb, uint8_t* dst_a, int width) {
  int i;
  for (i = 0; i < width - 1; i += 2) {
    dst_a[0] = src_argb[3];
    dst_a[1] = src_argb[7];
    dst_a += 2;
    src_argb += 8;
  }
  if (width & 1) {
    dst_a[0] = src_argb[3];
  }
}